

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solve_algorithms.cpp
# Opt level: O0

ValueRep __thiscall
Clasp::BasicSolve::State::solve(State *this,Solver *s,SolveParams *p,SolveLimits *lim)

{
  ushort uVar1;
  unsigned_long uVar2;
  Solver *pSVar3;
  byte bVar4;
  bool bVar5;
  uint32 uVar6;
  SeqUpdate SVar7;
  uint32 uVar8;
  Constraint *pCVar9;
  EnumerationConstraint *this_00;
  DynamicLimit *pDVar10;
  DynamicLimit *pDVar11;
  double *pdVar12;
  unsigned_long *puVar13;
  DecisionHeuristic *pDVar14;
  uint *puVar15;
  SolveLimits *in_RCX;
  undefined1 *puVar16;
  RestartParams *in_RDX;
  Solver *in_RSI;
  unsigned_long *in_RDI;
  double dVar17;
  undefined1 auVar18 [16];
  ScheduleStrategy SVar19;
  DBInfo DVar20;
  ReduceStrategy t;
  EventType progress;
  uint64 n;
  uint64 limRestarts;
  ConflictLimits cLimit;
  ValueRep result;
  DBInfo db;
  ScheduleStrategy dbGrow;
  RestartSchedule rs;
  SearchLimits sLimit;
  WeightLitVec inDegree;
  uint32 resetMode;
  undefined7 in_stack_fffffffffffffbd8;
  undefined1 in_stack_fffffffffffffbdf;
  State *in_stack_fffffffffffffbe0;
  uint64 in_stack_fffffffffffffbe8;
  Solver *in_stack_fffffffffffffbf0;
  undefined4 in_stack_fffffffffffffbf8;
  uint32 in_stack_fffffffffffffbfc;
  Solver *in_stack_fffffffffffffc00;
  float in_stack_fffffffffffffc08;
  uint32 in_stack_fffffffffffffc0c;
  DynamicLimit *in_stack_fffffffffffffc10;
  uint64 local_3b0;
  Solver *in_stack_fffffffffffffca0;
  float in_stack_fffffffffffffcac;
  Solver *in_stack_fffffffffffffcb0;
  uint32 in_stack_fffffffffffffcb8;
  float in_stack_fffffffffffffcbc;
  DynamicLimit *in_stack_fffffffffffffcc0;
  uint32 in_stack_fffffffffffffcc8;
  uint32 in_stack_fffffffffffffccc;
  SolveParams *in_stack_fffffffffffffd40;
  undefined7 in_stack_fffffffffffffd48;
  undefined1 in_stack_fffffffffffffd4f;
  State *in_stack_fffffffffffffd50;
  bool local_219;
  uint local_214;
  uint local_1f8;
  uint local_1f4;
  double local_1f0;
  double local_1e8;
  double local_1e0;
  DBInfo local_1d8;
  DBInfo local_1c8;
  ReduceStrategy local_1bc;
  uint local_1b8;
  uint local_1b4;
  DBInfo local_1b0;
  DBInfo local_19c;
  DBInfo local_190;
  DBInfo local_17c;
  unsigned_long local_170;
  double local_168;
  uint local_160;
  uint64 local_150;
  uint local_148;
  Solver *local_140;
  uint local_134;
  undefined1 local_130 [64];
  uint64 local_f0;
  ConflictLimits local_e8;
  byte local_c5;
  DBInfo local_c4;
  ScheduleStrategy local_b8;
  ScheduleStrategy local_a8 [2];
  unsigned_long local_80;
  Solver *local_78;
  DynamicLimit *local_70;
  BlockLimit *local_68;
  undefined1 local_60;
  uint64 local_58;
  long local_50;
  uint local_48;
  pod_vector<std::pair<Clasp::Literal,_int>,_std::allocator<std::pair<Clasp::Literal,_int>_>_>
  local_40;
  uint local_2c;
  SolveLimits *local_28;
  RestartParams *local_20;
  Solver *local_18;
  byte local_1;
  
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  pCVar9 = Solver::enumerationConstraint(in_RSI);
  if (pCVar9 == (Constraint *)0x0) {
    local_214 = 0;
  }
  else {
    this_00 = (EnumerationConstraint *)Solver::enumerationConstraint(local_18);
    bVar4 = EnumerationConstraint::resetMode(this_00);
    local_214 = (uint)bVar4;
  }
  local_2c = local_214;
  bVar5 = Solver::hasConflict((Solver *)0x1e0931);
  if (bVar5) {
    uVar8 = Solver::decisionLevel((Solver *)0x1e0944);
    uVar6 = Solver::rootLevel(local_18);
    if (uVar8 == uVar6) {
      local_219 = (*(byte *)((long)in_RDI + 0x4c) & 1) != 0 || (local_2c & 2) != 0;
      *(bool *)((long)in_RDI + 0x4c) = local_219;
      return '\x02';
    }
  }
  if ((*(byte *)((long)in_RDI + 0x4c) & 1) != 0) {
    ~State(in_stack_fffffffffffffbe0);
    State(in_stack_fffffffffffffd50,
          (Solver *)CONCAT17(in_stack_fffffffffffffd4f,in_stack_fffffffffffffd48),
          in_stack_fffffffffffffd40);
  }
  bk_lib::
  pod_vector<std::pair<Clasp::Literal,_int>,_std::allocator<std::pair<Clasp::Literal,_int>_>_>::
  pod_vector((pod_vector<std::pair<Clasp::Literal,_int>,_std::allocator<std::pair<Clasp::Literal,_int>_>_>
              *)in_stack_fffffffffffffc00);
  SearchLimits::SearchLimits((SearchLimits *)in_stack_fffffffffffffbe0);
  local_a8[0]._0_4_ = *(undefined4 *)&(local_20->rsSched).super_ScheduleStrategy.field_0x0;
  local_a8[0].idx = (local_20->rsSched).super_ScheduleStrategy.idx;
  local_a8[0].len = (local_20->rsSched).super_ScheduleStrategy.len;
  local_a8[0].grow = (local_20->rsSched).super_ScheduleStrategy.grow;
  local_b8._0_8_ = local_20[1].block;
  local_b8.len = *(uint32 *)&local_20[1].field_0x18;
  local_b8.grow = *(float *)&local_20[1].field_0x1c;
  local_c4.size = 0;
  local_c4.locked = 0;
  local_c4.pinned = *(uint32 *)((long)in_RDI + 0x44);
  local_c5 = 0;
  local_e8.reduce =
       ScheduleStrategy::current
                 ((ScheduleStrategy *)CONCAT17(in_stack_fffffffffffffbdf,in_stack_fffffffffffffbd8))
  ;
  local_e8.reduce = local_e8.reduce + (uint)in_RDI[8];
  local_e8.grow = *in_RDI;
  local_e8.restart = 0xffffffffffffffff;
  local_e8.global = local_28->conflicts;
  local_f0 = local_28->restarts;
  bVar5 = ScheduleStrategy::disabled(&local_b8);
  if (!bVar5) {
    ScheduleStrategy::advanceTo
              ((ScheduleStrategy *)in_stack_fffffffffffffbf0,
               (uint32)(in_stack_fffffffffffffbe8 >> 0x20));
  }
  if (((int)in_RDI[7] == -1) && (SVar7 = RestartParams::update(local_20), SVar7 == seq_disable)) {
    SearchLimits::SearchLimits((SearchLimits *)in_stack_fffffffffffffbe0);
    memcpy(&local_80,local_130,0x3c);
  }
  else {
    bVar5 = RestartSchedule::isDynamic((RestartSchedule *)local_a8);
    if ((bVar5) &&
       (pDVar10 = SingleOwnerPtr<Clasp::DynamicLimit,_Clasp::DeleteObject>::get
                            ((SingleOwnerPtr<Clasp::DynamicLimit,_Clasp::DeleteObject> *)0x1e0bdc),
       pDVar10 != (DynamicLimit *)0x0)) {
      if ((int)in_RDI[7] == 0) {
        SingleOwnerPtr<Clasp::DynamicLimit,_Clasp::DeleteObject>::operator->
                  ((SingleOwnerPtr<Clasp::DynamicLimit,_Clasp::DeleteObject> *)0x1e0c17);
        RestartSchedule::k((RestartSchedule *)local_a8);
        RestartSchedule::adjustLim((RestartSchedule *)0x1e0c46);
        DynamicLimit::resetAdjust
                  ((DynamicLimit *)in_stack_fffffffffffffbf0,
                   (float)(in_stack_fffffffffffffbe8 >> 0x20),(Type)in_stack_fffffffffffffbe8,
                   (uint32)((ulong)in_stack_fffffffffffffbe0 >> 0x20),
                   SUB81((ulong)in_stack_fffffffffffffbe0 >> 0x18,0));
      }
      local_70 = SingleOwnerPtr<Clasp::DynamicLimit,_Clasp::DeleteObject>::get
                           ((SingleOwnerPtr<Clasp::DynamicLimit,_Clasp::DeleteObject> *)0x1e0c88);
      pDVar10 = SingleOwnerPtr<Clasp::DynamicLimit,_Clasp::DeleteObject>::operator->
                          ((SingleOwnerPtr<Clasp::DynamicLimit,_Clasp::DeleteObject> *)0x1e0cb3);
      uVar8 = (pDVar10->adjust).limit;
      pDVar10 = SingleOwnerPtr<Clasp::DynamicLimit,_Clasp::DeleteObject>::operator->
                          ((SingleOwnerPtr<Clasp::DynamicLimit,_Clasp::DeleteObject> *)0x1e0cdf);
      pDVar11 = SingleOwnerPtr<Clasp::DynamicLimit,_Clasp::DeleteObject>::operator->
                          ((SingleOwnerPtr<Clasp::DynamicLimit,_Clasp::DeleteObject> *)0x1e0d0e);
      local_134 = (pDVar11->adjust).limit - 1;
      puVar15 = std::min<unsigned_int>(&(pDVar10->adjust).samples,&local_134);
      local_78 = (Solver *)(ulong)(uVar8 - *puVar15);
    }
    else {
      ScheduleStrategy::disabled(local_a8);
      ScheduleStrategy::advanceTo
                ((ScheduleStrategy *)in_stack_fffffffffffffbf0,
                 (uint32)(in_stack_fffffffffffffbe8 >> 0x20));
      local_78 = (Solver *)
                 ScheduleStrategy::current
                           ((ScheduleStrategy *)
                            CONCAT17(in_stack_fffffffffffffbdf,in_stack_fffffffffffffbd8));
    }
  }
  local_60 = RestartParams::local(local_20);
  local_68 = SingleOwnerPtr<Clasp::BlockLimit,_Clasp::DeleteObject>::get
                       ((SingleOwnerPtr<Clasp::BlockLimit,_Clasp::DeleteObject> *)0x1e0e1f);
  if (*(int *)&local_20[2].field_0x1c != 0) {
    local_50 = (ulong)*(uint *)&local_20[2].field_0x1c << 0x14;
  }
  local_140 = (Solver *)0x0;
  BasicSolveEvent::BasicSolveEvent
            ((BasicSolveEvent *)in_stack_fffffffffffffc00,
             (Solver *)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8),
             (EventOp)((ulong)in_stack_fffffffffffffbf0 >> 0x20),in_stack_fffffffffffffbe8,
             (uint32)((ulong)in_stack_fffffffffffffbe0 >> 0x20));
  SVar19._8_8_ = in_stack_fffffffffffffbe0;
  SVar19._0_8_ = in_stack_fffffffffffffbe8;
LAB_001e0e8e:
  if (local_e8.global != 0) {
    bVar5 = RestartParams::local(local_20);
    local_e8.restart = (uint64)local_78;
    if (bVar5) {
      local_e8.restart = (uint64)(Solver *)0xffffffffffffffff;
    }
    local_80 = 0;
    local_168 = (double)in_RDI[1] +
                (double)(local_c4.pinned *
                        -(*(int *)&local_20[2].rsSched.super_ScheduleStrategy >> 0x1f));
    pdVar12 = std::min<double>(&local_168,(double *)(in_RDI + 2));
    local_48 = (uint)(long)*pdVar12;
    local_150 = solve::ConflictLimits::min(SVar19._8_8_);
    local_148 = local_48;
    local_58 = local_150;
    if ((local_160 >> 4 & 0xff) != 0) {
      Solver::sharedContext(local_18);
      SharedContext::report
                (SVar19._8_8_,(Event *)CONCAT17(in_stack_fffffffffffffbdf,in_stack_fffffffffffffbd8)
                );
      local_160 = local_160 & 0xfffff00f;
    }
    local_c5 = Solver::search((Solver *)
                              CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8),
                              (SearchLimits *)in_stack_fffffffffffffcc0,
                              (double)CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8))
    ;
    puVar13 = std::min<unsigned_long>(&local_80,&local_58);
    local_140 = (Solver *)*puVar13;
    solve::ConflictLimits::update(&local_e8,(uint64)local_140);
    if (local_c5 == 0) {
      bVar5 = Solver::restartReached
                        (in_stack_fffffffffffffc00,
                         (SearchLimits *)
                         CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8));
      if (bVar5) {
        *(int *)(in_RDI + 7) = (int)in_RDI[7] + 1;
        if (((*(ulong *)&local_20->field_0x18 & 0xffff) != 0) &&
           ((int)((ulong)(uint)in_RDI[7] % (*(ulong *)&local_20->field_0x18 & 0xffff)) == 0)) {
          bk_lib::
          pod_vector<std::pair<Clasp::Literal,_int>,_std::allocator<std::pair<Clasp::Literal,_int>_>_>
          ::clear(&local_40);
          pDVar14 = Solver::heuristic((Solver *)0x1e127c);
          pSVar3 = local_18;
          uVar1 = *(ushort *)&local_20->field_0x1a;
          uVar8 = Solver::inDegree((Solver *)
                                   CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8),
                                   (WeightLitVec *)in_stack_fffffffffffffcb0);
          (*pDVar14->_vptr_DecisionHeuristic[0xb])
                    ((double)uVar1 / (double)uVar8,pDVar14,pSVar3,&local_40);
        }
        if (local_70 == (DynamicLimit *)0x0) {
          in_stack_fffffffffffffcb0 =
               (Solver *)
               ScheduleStrategy::next
                         ((ScheduleStrategy *)
                          CONCAT17(in_stack_fffffffffffffbdf,in_stack_fffffffffffffbd8));
          local_140 = in_stack_fffffffffffffcb0;
          local_78 = in_stack_fffffffffffffcb0;
        }
        else {
          in_stack_fffffffffffffccc = DynamicLimit::runLen(local_70);
          local_140 = (Solver *)(ulong)in_stack_fffffffffffffccc;
          in_stack_fffffffffffffcc0 = local_70;
          in_stack_fffffffffffffcc8 = RestartSchedule::lbdLim((RestartSchedule *)local_a8);
          in_stack_fffffffffffffcbc = RestartSchedule::k((RestartSchedule *)local_a8);
          in_stack_fffffffffffffcb8 =
               DynamicLimit::restart
                         (in_stack_fffffffffffffc10,in_stack_fffffffffffffc0c,
                          in_stack_fffffffffffffc08);
          local_78 = (Solver *)(ulong)in_stack_fffffffffffffcb8;
        }
        Solver::restart(SVar19._8_8_);
        DVar20 = local_190;
        if ((*(uint *)&local_20[2].rsSched.super_ScheduleStrategy >> 0x12 & 0x7f) != 0) {
          in_stack_fffffffffffffca0 = local_18;
          in_stack_fffffffffffffcac = ReduceParams::fRestart((ReduceParams *)(local_20 + 1));
          DVar20 = Solver::reduceLearnts
                             (in_stack_fffffffffffffcb0,in_stack_fffffffffffffcac,
                              (ReduceStrategy *)in_stack_fffffffffffffca0);
          local_17c = DVar20;
          local_c4 = DVar20;
        }
        local_190 = DVar20;
        if ((int)in_RDI[7] == (int)in_RDI[9]) {
          *(uint *)(in_RDI + 9) =
               (int)in_RDI[9] +
               ((uint)((ulong)*(undefined8 *)&local_20->field_0x18 >> 0x2e) & 0x3fff);
          Solver::shuffleOnNextSimplify(local_18);
        }
        local_f0 = local_f0 - 1;
        if (local_f0 == 0) goto LAB_001e1b71;
        (local_18->stats).super_CoreStats.lastRestart = (local_18->stats).super_CoreStats.analyzed;
        local_160 = local_160 & 0xfffff00f | 0x520;
      }
      else {
        bVar5 = RestartParams::local(local_20);
        if (!bVar5) {
          puVar13 = std::min<unsigned_long>((unsigned_long *)&local_140,(unsigned_long *)&local_78);
          local_78 = (Solver *)((long)local_78 - *puVar13);
        }
      }
      if (local_e8.reduce == 0) {
LAB_001e15f8:
        ReduceParams::fReduce((ReduceParams *)(local_20 + 1));
        DVar20 = Solver::reduceLearnts
                           (in_stack_fffffffffffffcb0,in_stack_fffffffffffffcac,
                            (ReduceStrategy *)in_stack_fffffffffffffca0);
        uVar2 = in_RDI[8];
        local_1b0 = DVar20;
        local_19c = DVar20;
        local_c4 = DVar20;
        if (local_e8.reduce == 0) {
          local_3b0 = ScheduleStrategy::next
                                ((ScheduleStrategy *)
                                 CONCAT17(in_stack_fffffffffffffbdf,in_stack_fffffffffffffbd8));
        }
        else {
          local_3b0 = ScheduleStrategy::current
                                ((ScheduleStrategy *)
                                 CONCAT17(in_stack_fffffffffffffbdf,in_stack_fffffffffffffbd8));
        }
        local_e8.reduce = (uint)uVar2 + local_3b0;
        local_1b4 = local_160 >> 4 & 0xff;
        local_1b8 = 0x44;
        puVar15 = std::max<unsigned_int>(&local_1b4,&local_1b8);
        local_160 = local_160 & 0xfffff00f | (uint)(byte)*puVar15 << 4;
        bVar5 = Solver::reduceReached(in_stack_fffffffffffffbf0,SVar19._0_8_);
        if ((bVar5) || ((double)in_RDI[1] <= (double)local_c4.pinned)) {
          ReduceStrategy::ReduceStrategy(&local_1bc);
          local_1bc = (ReduceStrategy)((uint)local_1bc & 0xe1fff87f | 0x14000000);
          local_c4.pinned = local_c4.pinned >> 1;
          DVar20 = Solver::reduceLearnts
                             (in_stack_fffffffffffffcb0,in_stack_fffffffffffffcac,
                              (ReduceStrategy *)in_stack_fffffffffffffca0);
          local_1c8.size = DVar20.size;
          local_c4.size = local_1c8.size;
          bVar5 = local_48 <= local_1c8.size;
          local_1d8 = DVar20;
          local_1c8 = DVar20;
          if (bVar5) {
            dVar17 = (double)in_RDI[1];
            local_1e8 = 100.0;
            uVar8 = Solver::numLearntConstraints((Solver *)0x1e18e8);
            local_1f0 = (double)uVar8 / 10.0;
            pdVar12 = std::max<double>(&local_1e8,&local_1f0);
            local_1e0 = dVar17 + *pdVar12;
            in_stack_fffffffffffffc10 =
                 (DynamicLimit *)std::min<double>(&local_1e0,(double *)(in_RDI + 2));
            in_RDI[1] = (unsigned_long)*(double *)&in_stack_fffffffffffffc10->adjust;
          }
        }
      }
      else {
        bVar5 = Solver::reduceReached(in_stack_fffffffffffffbf0,SVar19._0_8_);
        if (bVar5) goto LAB_001e15f8;
      }
      if ((Solver *)local_e8.grow != (Solver *)0x0) goto code_r0x001e198b;
      goto LAB_001e19c3;
    }
    local_160 = local_160 & 0xfffff00f | 0x450;
    if (local_c5 == 1) {
      SVar7 = RestartParams::update(local_20);
      if (SVar7 != seq_continue) {
        SVar7 = RestartParams::update(local_20);
        if (SVar7 == seq_repeat) {
          *(undefined4 *)(in_RDI + 7) = 0;
        }
        else {
          SVar7 = RestartParams::update(local_20);
          if (SVar7 == seq_disable) {
            *(undefined4 *)(in_RDI + 7) = 0xffffffff;
          }
        }
      }
    }
    bVar5 = ScheduleStrategy::disabled(&local_b8);
    if (!bVar5) {
      local_170 = 1;
      puVar13 = std::max<unsigned_long>(&local_e8.grow,&local_170);
      *in_RDI = *puVar13;
    }
    Solver::sharedContext(local_18);
    SharedContext::report
              (SVar19._8_8_,(Event *)CONCAT17(in_stack_fffffffffffffbdf,in_stack_fffffffffffffbd8));
  }
LAB_001e1b71:
  *(uint32 *)((long)in_RDI + 0x44) = local_c4.pinned;
  *(bool *)((long)in_RDI + 0x4c) = (local_2c & local_c5) != 0;
  (local_18->stats).super_CoreStats.lastRestart =
       (local_18->stats).super_CoreStats.analyzed - (local_18->stats).super_CoreStats.lastRestart;
  bVar5 = SolveLimits::enabled(local_28);
  if (bVar5) {
    if (local_28->conflicts != 0xffffffffffffffff) {
      local_28->conflicts = local_e8.global;
    }
    if (local_28->restarts != 0xffffffffffffffff) {
      local_28->restarts = local_f0;
    }
  }
  local_1 = local_c5;
  bk_lib::
  pod_vector<std::pair<Clasp::Literal,_int>,_std::allocator<std::pair<Clasp::Literal,_int>_>_>::
  ~pod_vector((pod_vector<std::pair<Clasp::Literal,_int>,_std::allocator<std::pair<Clasp::Literal,_int>_>_>
               *)0x1e1c2f);
  return local_1;
code_r0x001e198b:
  bVar5 = ScheduleStrategy::defaulted(&local_b8);
  in_stack_fffffffffffffc0c = CONCAT13(bVar5,(int3)in_stack_fffffffffffffc0c);
  if ((bVar5) && ((local_160 >> 4 & 0xff) == 0x52)) {
LAB_001e19c3:
    if ((Solver *)local_e8.grow == (Solver *)0x0) {
      in_stack_fffffffffffffc00 =
           (Solver *)
           ScheduleStrategy::next
                     ((ScheduleStrategy *)
                      CONCAT17(in_stack_fffffffffffffbdf,in_stack_fffffffffffffbd8));
      *(int *)((long)in_RDI + 0x3c) = *(int *)((long)in_RDI + 0x3c) + 1;
      local_140 = in_stack_fffffffffffffc00;
      local_e8.grow = (uint64)in_stack_fffffffffffffc00;
    }
    in_stack_fffffffffffffbfc = Solver::numLearntConstraints((Solver *)0x1e1a15);
    puVar16 = &(((SolveEvent<Clasp::BasicSolveEvent> *)&local_140->rng)->
               super_Event_t<Clasp::BasicSolveEvent>).super_Event.field_0x0 +
              in_stack_fffffffffffffbfc;
    auVar18._8_4_ = (int)((ulong)puVar16 >> 0x20);
    auVar18._0_8_ = puVar16;
    auVar18._12_4_ = 0x45300000;
    dVar17 = (auVar18._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)puVar16) - 4503599627370496.0);
    if ((double)in_RDI[1] <= dVar17 && dVar17 != (double)in_RDI[1]) {
      in_RDI[1] = (unsigned_long)
                  ((double)in_RDI[1] * (double)local_20[2].rsSched.super_ScheduleStrategy.grow);
      local_1f4 = local_160 >> 4 & 0xff;
      local_1f8 = 0x47;
      in_stack_fffffffffffffbf0 = (Solver *)std::max<unsigned_int>(&local_1f4,&local_1f8);
      local_160 = local_160 & 0xfffff00f |
                  (((anon_struct_20_5_f528b763_for_adjust *)&in_stack_fffffffffffffbf0->rng)->limit
                  & 0xff) << 4;
    }
    if ((double)in_RDI[2] <= (double)in_RDI[1] && (double)in_RDI[1] != (double)in_RDI[2]) {
      in_RDI[1] = in_RDI[2];
      local_e8.grow = 0xffffffffffffffff;
      SVar19 = ScheduleStrategy::none();
      local_b8 = SVar19;
    }
  }
  goto LAB_001e0e8e;
}

Assistant:

ValueRep BasicSolve::State::solve(Solver& s, const SolveParams& p, SolveLimits& lim) {
	assert(!lim.reached());
	const uint32 resetMode = s.enumerationConstraint() ? static_cast<const EnumerationConstraint*>(s.enumerationConstraint())->resetMode() : 0u;
	if (s.hasConflict() && s.decisionLevel() == s.rootLevel()) {
		resetState = resetState || (resetMode & value_false) != 0;
		return value_false;
	}
	struct ConflictLimits {
		uint64 reduce;  // current reduce limit
		uint64 grow;    // current limit for next growth operation
		uint64 restart; // current restart limit
		uint64 global;  // current global limit
		uint64 min()      const { return std::min(std::min(reduce, grow), std::min(restart, global)); }
		void  update(uint64 x)  { reduce -= x; grow -= x; restart -= x; global -= x; }
	};
	if (resetState) {
		this->~State();
		new (this) State(s, p);
	}
	WeightLitVec inDegree;
	SearchLimits     sLimit;
	RestartSchedule  rs     = p.restart.rsSched;
	ScheduleStrategy dbGrow = p.reduce.growSched;
	Solver::DBInfo   db     = {0,0,dbPinned};
	ValueRep         result = value_free;
	ConflictLimits   cLimit = {dbRed.current() + dbRedInit, dbGrowNext, UINT64_MAX, lim.conflicts};
	uint64      limRestarts = lim.restarts;
	if (!dbGrow.disabled())  { dbGrow.advanceTo(nGrow); }
	if (nRestart == UINT32_MAX && p.restart.update() == RestartParams::seq_disable) {
		sLimit = SearchLimits();
	}
	else if (rs.isDynamic() && dynRestart.get()) {
		if (!nRestart) dynRestart->resetAdjust(rs.k(), DynamicLimit::lbd_limit, rs.adjustLim(), true);
		sLimit.restart.dynamic   = dynRestart.get();
		sLimit.restart.conflicts = dynRestart->adjust.limit - std::min(dynRestart->adjust.samples, dynRestart->adjust.limit - 1);
	}
	else {
		rs.advanceTo(!rs.disabled() ? nRestart : 0);
		sLimit.restart.conflicts = rs.current();
	}
	sLimit.restart.local = p.restart.local();
	sLimit.restart.block = rsBlock.get();
	if (p.reduce.memMax) {
		sLimit.memory = static_cast<uint64>(p.reduce.memMax)<<20;
	}
	uint64 n = 0;
	for (EventType progress(s, EventType::event_restart, 0, 0); cLimit.global; ) {
		cLimit.restart   = !p.restart.local() ? sLimit.restart.conflicts : UINT64_MAX;
		sLimit.used      = 0;
		sLimit.learnts   = (uint32)std::min(dbMax + (db.pinned*p.reduce.strategy.noGlue), dbHigh);
		sLimit.conflicts = cLimit.min(); assert(sLimit.conflicts);
		progress.cLimit  = sLimit.conflicts;
		progress.lLimit  = sLimit.learnts;
		if (progress.op) { s.sharedContext()->report(progress); progress.op = (uint32)EventType::event_none; }
		result = s.search(sLimit, p.randProb);
		cLimit.update(n = std::min(sLimit.used, sLimit.conflicts)); // number of conflicts in this iteration
		if (result != value_free) {
			progress.op = static_cast<uint32>(EventType::event_exit);
			if (result == value_true && p.restart.update() != RestartParams::seq_continue) {
				if      (p.restart.update() == RestartParams::seq_repeat) { nRestart = 0; }
				else if (p.restart.update() == RestartParams::seq_disable){ nRestart = UINT32_MAX; }
			}
			if (!dbGrow.disabled()) { dbGrowNext = std::max(cLimit.grow, uint64(1)); }
			s.sharedContext()->report(progress);
			break;
		}
		if (s.restartReached(sLimit)) {
			// restart reached - do restart
			++nRestart;
			if (p.restart.counterRestart && (nRestart % p.restart.counterRestart) == 0 ) {
				inDegree.clear();
				s.heuristic()->bump(s, inDegree, p.restart.counterBump / (double)s.inDegree(inDegree));
			}
			if (sLimit.restart.dynamic) {
				n = sLimit.restart.dynamic->runLen();
				sLimit.restart.conflicts = sLimit.restart.dynamic->restart(rs.lbdLim(), rs.k());
			}
			else {
				sLimit.restart.conflicts = n = rs.next();
			}
			s.restart();
			if (p.reduce.strategy.fRestart){ db        = s.reduceLearnts(p.reduce.fRestart(), p.reduce.strategy); }
			if (nRestart == rsShuffle)     { rsShuffle+= p.restart.shuffleNext; s.shuffleOnNextSimplify();}
			if (--limRestarts == 0)        { break; }
			s.stats.lastRestart = s.stats.analyzed;
			progress.op         = (uint32)EventType::event_restart;
		}
		else if (!p.restart.local()) {
			sLimit.restart.conflicts -= std::min(n, sLimit.restart.conflicts);
		}
		if (cLimit.reduce == 0 || s.reduceReached(sLimit)) {
			// reduction reached - remove learnt constraints
			db              = s.reduceLearnts(p.reduce.fReduce(), p.reduce.strategy);
			cLimit.reduce   = dbRedInit + (cLimit.reduce == 0 ? dbRed.next() : dbRed.current());
			progress.op     = std::max(progress.op, (uint32)EventType::event_deletion);
			if (s.reduceReached(sLimit) || db.pinned >= dbMax) {
				ReduceStrategy t; t.algo = 2; t.score = 2; t.glue = 0;
				db.pinned /= 2;
				db.size    = s.reduceLearnts(0.5f, t).size;
				if (db.size >= sLimit.learnts) { dbMax = std::min(dbMax + std::max(100.0, s.numLearntConstraints()/10.0), dbHigh); }
			}
		}
		if (cLimit.grow == 0 || (dbGrow.defaulted() && progress.op == (uint32)EventType::event_restart)) {
			// grow sched reached - increase max db size
			if (cLimit.grow == 0)                      { cLimit.grow = n = dbGrow.next(); ++nGrow; }
			if ((s.numLearntConstraints() + n) > dbMax){ dbMax  *= p.reduce.fGrow; progress.op = std::max(progress.op, (uint32)EventType::event_grow); }
			if (dbMax > dbHigh)                        { dbMax   = dbHigh; cLimit.grow = UINT64_MAX; dbGrow = ScheduleStrategy::none(); }
		}
	}
	dbPinned            = db.pinned;
	resetState          = (resetMode & result) != 0u;
	s.stats.lastRestart = s.stats.analyzed - s.stats.lastRestart;
	if (lim.enabled()) {
		if (lim.conflicts != UINT64_MAX) { lim.conflicts = cLimit.global; }
		if (lim.restarts  != UINT64_MAX) { lim.restarts  = limRestarts;   }
	}
	return result;
}